

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsJacBSWrapper(sunrealtype t,N_Vector yB,N_Vector fyB,SUNMatrix JB,void *cvode_mem,
                    N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_stack_00000008;
  int retval;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem *in_stack_ffffffffffffff78;
  CVadjMem *in_stack_ffffffffffffff80;
  CVodeMem *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  long local_60;
  long local_58;
  CVodeMem local_50;
  int local_c;
  
  local_c = cvLs_AccessLMemBCur(in_stack_ffffffffffffff98,
                                (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ),in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                (CVLsMemB *)0x13e079);
  if (local_c == 0) {
    if (*(int *)(local_58 + 0xbc) == 0) {
      iVar1 = (**(code **)(local_58 + 0xa8))
                        (in_XMM0_Qa,local_50,*(undefined8 *)(local_58 + 0x1f8),0);
    }
    else {
      iVar1 = (**(code **)(local_58 + 0xa8))
                        (in_XMM0_Qa,local_50,*(undefined8 *)(local_58 + 0x1f8),
                         *(undefined8 *)(local_58 + 0x200));
    }
    if (iVar1 == 0) {
      local_c = (**(code **)((long)in_stack_ffffffffffffff98 + 8))
                          (in_XMM0_Qa,*(undefined8 *)(local_58 + 0x1f8),
                           *(undefined8 *)(local_58 + 0x200),in_RDI,in_RSI,in_RDX,
                           *(undefined8 *)(local_60 + 0x40),in_R8,in_R9,in_stack_00000008);
    }
    else {
      cvProcessError(local_50,-1,0x9c1,"cvLsJacBSWrapper",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
      local_c = -1;
    }
  }
  return local_c;
}

Assistant:

static int cvLsJacBSWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                            SUNMatrix JB, void* cvode_mem, N_Vector tmp1B,
                            N_Vector tmp2B, N_Vector tmp3B)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacBSWrapper", &cv_mem, &ca_mem,
                               &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  if (ca_mem->ca_IMinterpSensi)
  {
    retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, ca_mem->ca_yStmp);
  }
  else { retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL); }
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint dense djacBS routine (of type CVLsDenseJacFnBS) */
  return (cvlsB_mem->jacBS(t, ca_mem->ca_ytmp, ca_mem->ca_yStmp, yB, fyB, JB,
                           cvB_mem->cv_user_data, tmp1B, tmp2B, tmp3B));
}